

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::cleanup::ChunkList::Cleanup(ChunkList *this,SerialArena *arena)

{
  Chunk *this_00;
  SizedPtr mem;
  AllocationPolicy *policy;
  CleanupNode *pCVar1;
  Chunk *next;
  CleanupNode *pCStack_80;
  int i;
  CleanupNode *prefetch;
  int kPrefetchDistance;
  CleanupNode *first;
  CleanupNode *it;
  GetDeallocator deallocator;
  Chunk *c;
  SerialArena *arena_local;
  ChunkList *this_local;
  
  deallocator.dealloc_ = (_func_void_void_ptr_size_t *)this->head_;
  if ((Chunk *)deallocator.dealloc_ != (Chunk *)0x0) {
    policy = ThreadSafeArena::AllocPolicy(arena->parent_);
    anon_unknown_12::GetDeallocator::GetDeallocator((GetDeallocator *)&it,policy);
    first = this->next_ + -1;
    while( true ) {
      pCVar1 = Chunk::First((Chunk *)deallocator.dealloc_);
      next._4_4_ = 0;
      for (pCStack_80 = first; pCVar1 <= pCStack_80 && next._4_4_ < 8; pCStack_80 = pCStack_80 + -1)
      {
        next._4_4_ = next._4_4_ + 1;
      }
      for (; pCVar1 <= pCStack_80; pCStack_80 = pCStack_80 + -1) {
        (*first->destructor)(first->elem);
        first = first + -1;
      }
      for (; pCVar1 <= first; first = first + -1) {
        (*first->destructor)(first->elem);
      }
      this_00 = *(Chunk **)deallocator.dealloc_;
      mem.n = *(size_t *)(deallocator.dealloc_ + 8);
      mem.p = deallocator.dealloc_;
      anon_unknown_12::GetDeallocator::operator()((GetDeallocator *)&it,mem);
      if (this_00 == (Chunk *)0x0) break;
      deallocator.dealloc_ = (_func_void_void_ptr_size_t *)this_00;
      first = Chunk::Last(this_00);
    }
  }
  return;
}

Assistant:

void ChunkList::Cleanup(const SerialArena& arena) {
  Chunk* c = head_;
  if (c == nullptr) return;
  GetDeallocator deallocator(arena.parent_.AllocPolicy());

  // Iterate backwards in order to destroy in the right order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    // A prefetch distance of 8 here was chosen arbitrarily.
    constexpr int kPrefetchDistance = 8;
    CleanupNode* prefetch = it;
    // Prefetch the first kPrefetchDistance nodes.
    for (int i = 0; prefetch >= first && i < kPrefetchDistance;
         --prefetch, ++i) {
      prefetch->Prefetch();
    }
    // For the middle nodes, run destructor and prefetch the node
    // kPrefetchDistance after the current one.
    for (; prefetch >= first; --it, --prefetch) {
      it->Destroy();
      prefetch->Prefetch();
    }
    // Note: we could consider prefetching `next` chunk earlier.
    absl::PrefetchToLocalCacheNta(c->next);
    // Destroy the rest without prefetching.
    for (; it >= first; --it) {
      it->Destroy();
    }
    Chunk* next = c->next;
    deallocator({c, c->size});
    if (next == nullptr) return;
    c = next;
    it = c->Last();
  };
}